

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O3

void __thiscall UDMFParser::ParseSector(UDMFParser *this,sector_t_conflict *sec,int index)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  bool bVar4;
  short sVar5;
  short sVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  FDynamicColormap *pFVar11;
  int mask;
  anon_union_4_2_12391d7c_for_PalEntry_0 color;
  char *pcVar12;
  double dVar13;
  FString tagstring;
  FName key;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_1dc;
  uint local_1d8;
  uint local_1d4;
  int local_1c0;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_1bc;
  FString local_1b8;
  char *local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  FString local_178;
  FName local_16c;
  DWORD *local_168;
  double local_160;
  double local_158;
  WORD *local_150;
  undefined1 local_148 [8];
  UDMFParserBase local_140;
  
  local_1b8.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  memset(sec,0,0x218);
  sec->lightlevel = 0xa0;
  sec->planes[0].xform.xScale = 1.0;
  sec->planes[0].xform.yScale = 1.0;
  sec->planes[1].xform.xScale = 1.0;
  sec->planes[1].xform.yScale = 1.0;
  sec->planes[0].alpha = 1.0;
  sec->planes[1].alpha = 1.0;
  sec->touching_thinglist = (msecnode_t *)0x0;
  sec->render_thinglist = (msecnode_t *)0x0;
  sec->touching_renderthings = (msecnode_t *)0x0;
  sec->seqType = ((level.flags >> 0xc & 1) != 0) - 1;
  sec->prevsec = -1;
  sec->nextsec = -1;
  sec->sectornum = index;
  sec->damageinterval = 0x20;
  sec->terrainnum[0] = -1;
  sec->terrainnum[1] = -1;
  if (this->floordrop == true) {
    sec->Flags = 4;
  }
  sec->gravity = 1.0;
  sec->ZoneNumber = 0xffff;
  sec->friction = 0.90625;
  sec->movefactor = 0.03125;
  FScanner::MustGetToken((FScanner *)this,0x7b);
  piVar1 = &sec->planes[0].Flags;
  piVar2 = &sec->planes[1].Flags;
  local_168 = &sec->Flags;
  local_150 = &sec->MoreFlags;
  local_180 = 0.0;
  local_1c0 = -1;
  local_190 = 0.0;
  local_188 = 0.0;
  local_158 = 0.0;
  local_1a0 = 0.0;
  local_1a8 = 0.0;
  local_198 = 0.0;
  local_160 = 0.0;
  local_1d4 = 0;
  local_1d8 = 0;
  local_1dc.d = 0xffffffff;
  local_1bc.d = 0xffffffff;
LAB_00461f0d:
  do {
    bVar4 = FScanner::CheckToken((FScanner *)this,0x7d);
    if (bVar4) {
      if (((FNullStringData *)(local_1b8.Chars + -0xc))->Len != 0) {
        FScanner::FScanner((FScanner *)&local_140.sc.Number);
        FString::AttachToOther(&local_178,&local_1b8);
        FScanner::OpenString((FScanner *)&local_140.sc.Number,"tagstring",&local_178);
        FString::~FString(&local_178);
        while (bVar4 = FScanner::CheckNumber((FScanner *)&local_140.sc.Number), bVar4) {
          if (local_140.sc.Name.Index != 0) {
            FTagManager::AddSectorTag(&tagManager,index,local_140.sc.Name.Index);
          }
        }
        FScanner::~FScanner((FScanner *)&local_140.sc.Number);
      }
      if (sec->damageamount == 0) {
        (sec->damagetype).super_FName.Index = 0;
        sec->damageinterval = 0;
        sec->leakydamage = 0;
        sec->Flags = sec->Flags & 0xfffff87f;
      }
      if (local_1d4 == 0xf) {
        dVar13 = c_sqrt(local_188 * local_188 + local_190 * local_190 + local_180 * local_180);
        dVar13 = (double)(~-(ulong)(dVar13 != 0.0) & (ulong)dVar13 |
                         (ulong)(1.0 / dVar13) & -(ulong)(dVar13 != 0.0));
        (sec->floorplane).normal.X = local_180 * dVar13;
        (sec->floorplane).normal.Y = local_190 * dVar13;
        (sec->floorplane).normal.Z = local_188 * dVar13;
        (sec->floorplane).D = local_158;
        dVar13 = -1.0 / (local_188 * dVar13);
        lVar10 = 0xd0;
      }
      else {
        (sec->floorplane).normal.X = 0.0;
        (sec->floorplane).normal.Y = 0.0;
        dVar13 = -sec->planes[0].TexZ;
        (sec->floorplane).normal.Z = 1.0;
        (sec->floorplane).negiC = -1.0;
        lVar10 = 200;
      }
      *(double *)((long)&sec->planes[0].xform.xOffs + lVar10) = dVar13;
      if (local_1d8 == 0xf) {
        dVar13 = c_sqrt(local_198 * local_198 + local_1a8 * local_1a8 + local_1a0 * local_1a0);
        dVar13 = (double)(~-(ulong)(dVar13 != 0.0) & (ulong)dVar13 |
                         (ulong)(1.0 / dVar13) & -(ulong)(dVar13 != 0.0));
        (sec->ceilingplane).normal.X = local_1a0 * dVar13;
        (sec->ceilingplane).normal.Y = local_1a8 * dVar13;
        (sec->ceilingplane).normal.Z = local_198 * dVar13;
        (sec->ceilingplane).D = local_160;
        dVar13 = -1.0 / (local_198 * dVar13);
        lVar10 = 0xf8;
      }
      else {
        dVar13 = sec->planes[1].TexZ;
        (sec->ceilingplane).normal.X = 0.0;
        (sec->ceilingplane).normal.Y = 0.0;
        (sec->ceilingplane).normal.Z = -1.0;
        (sec->ceilingplane).negiC = 1.0;
        lVar10 = 0xf0;
      }
      *(double *)((long)&sec->planes[0].xform.xOffs + lVar10) = dVar13;
      if (((local_1bc.d == 0xffffffff) && (local_1dc.d == 0xffffffff)) && (local_1c0 == -1)) {
        if ((level.outsidefog == 0xff000000) ||
           ((sec->planes[1].Texture.texnum != skyflatnum.texnum && ((char)sec->special != 'W')))) {
          pFVar11 = this->normMap;
          if (pFVar11 == (FDynamicColormap *)0x0) {
            pFVar11 = GetSpecialLights((PalEntry)0xffffff,(PalEntry)level.fadeto,
                                       NormalLight.Desaturate);
            this->normMap = pFVar11;
          }
        }
        else {
          pFVar11 = this->fogMap;
          if (pFVar11 == (FDynamicColormap *)0x0) {
            pFVar11 = GetSpecialLights((PalEntry)0xffffff,(PalEntry)level.outsidefog,0);
            this->fogMap = pFVar11;
          }
        }
      }
      else {
        color.d = 0xffffff;
        if (local_1bc.d != 0xffffffff) {
          color = local_1bc;
        }
        if ((local_1dc.d == 0xffffffff) &&
           ((local_1dc.d = level.outsidefog, level.outsidefog == 0xff000000 ||
            ((sec->planes[1].Texture.texnum != skyflatnum.texnum && ((char)sec->special != 'W'))))))
        {
          local_1dc.d = level.fadeto;
        }
        if (local_1c0 == -1) {
          local_1c0 = NormalLight.Desaturate;
        }
        pFVar11 = GetSpecialLights((PalEntry)color,(PalEntry)local_1dc,local_1c0);
      }
      sec->ColorMap = pFVar11;
      FString::~FString(&local_1b8);
      return;
    }
    UDMFParserBase::ParseKey((UDMFParserBase *)&local_140.sc.Number,SUB81(this,0),(bool *)0x0);
    iVar7 = local_140.sc.Number;
    switch(local_140.sc.Number) {
    case 299:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[299].Text);
      }
      sec->planes[0].TexZ = (this->super_UDMFParserBase).sc.Float;
      goto LAB_00461f0d;
    case 300:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[300].Text);
      }
      sec->planes[1].TexZ = (this->super_UDMFParserBase).sc.Float;
      goto LAB_00461f0d;
    case 0x12d:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0x12d].Text);
      }
      iVar7 = (this->super_UDMFParserBase).sc.Number;
      if (0x7ffe < iVar7) {
        iVar7 = 0x7fff;
      }
      sVar5 = (short)iVar7;
      if (iVar7 < -0x7fff) {
        sVar5 = -0x8000;
      }
      sec->lightlevel = sVar5;
      goto LAB_00461f0d;
    case 0x12e:
      iVar7 = 0;
      if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
        iVar7 = 0;
        FScanner::ScriptMessage
                  ((FScanner *)this,"String value expected for key \'%s\'",
                   FName::NameData.NameArray[0x12e].Text);
      }
      goto LAB_00462109;
    case 0x12f:
      iVar7 = 1;
      if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"String value expected for key \'%s\'",
                   FName::NameData.NameArray[0x12f].Text);
      }
LAB_00462109:
      SetTexture(sec,index,iVar7,(this->super_UDMFParserBase).parsedString.Chars,this->missingTex,
                 false);
      goto LAB_00461f0d;
    }
    if (local_140.sc.Number == 0xed) break;
    if (local_140.sc.Number == 0x11f) {
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0x11f].Text);
      }
      FTagManager::AddSectorTag(&tagManager,index,(this->super_UDMFParserBase).sc.Number);
      goto LAB_00461f0d;
    }
    if (((this->super_UDMFParserBase).namespace_bits & 0x70) == 0) goto switchD_0046215e_caseD_1b0;
    mask = 0x20;
    iVar8 = 0x20;
    piVar9 = piVar1;
    switch(local_140.sc.Number) {
    case 399:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[399].Text);
      }
      sec->planes[0].xform.xOffs = (this->super_UDMFParserBase).sc.Float;
      goto LAB_00461f0d;
    case 400:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[400].Text);
      }
      sec->planes[0].xform.yOffs = (this->super_UDMFParserBase).sc.Float;
      goto LAB_00461f0d;
    case 0x191:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x191].Text);
      }
      sec->planes[1].xform.xOffs = (this->super_UDMFParserBase).sc.Float;
      goto LAB_00461f0d;
    case 0x192:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x192].Text);
      }
      sec->planes[1].xform.yOffs = (this->super_UDMFParserBase).sc.Float;
      goto LAB_00461f0d;
    case 0x193:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x193].Text);
      }
      sec->planes[0].xform.xScale = (this->super_UDMFParserBase).sc.Float;
      goto LAB_00461f0d;
    case 0x194:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x194].Text);
      }
      sec->planes[0].xform.yScale = (this->super_UDMFParserBase).sc.Float;
      goto LAB_00461f0d;
    case 0x195:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x195].Text);
      }
      sec->planes[1].xform.xScale = (this->super_UDMFParserBase).sc.Float;
      goto LAB_00461f0d;
    case 0x196:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x196].Text);
      }
      sec->planes[1].xform.yScale = (this->super_UDMFParserBase).sc.Float;
      goto LAB_00461f0d;
    case 0x197:
      UDMFParserBase::CheckAngle(&local_140,(char *)this);
      sec->planes[0].xform.Angle.Degrees = (double)local_140.sc.String;
      goto LAB_00461f0d;
    case 0x198:
      UDMFParserBase::CheckAngle((UDMFParserBase *)local_148,(char *)this);
      sec->planes[1].xform.Angle.Degrees = (double)local_148;
      goto LAB_00461f0d;
    case 0x199:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0x199].Text);
      }
      sec->planes[0].Light = (this->super_UDMFParserBase).sc.Number;
      goto LAB_00461f0d;
    case 0x19a:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0x19a].Text);
      }
      sec->planes[1].Light = (this->super_UDMFParserBase).sc.Number;
      goto LAB_00461f0d;
    case 0x19b:
      uVar3 = (this->super_UDMFParserBase).sc.TokenType;
      if ((uVar3 & 0xfffffffe) == 0x150) {
        if (uVar3 == 0x150) {
          *(byte *)piVar1 = (byte)*piVar1 | 1;
          goto LAB_00461f0d;
        }
      }
      else {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Boolean value expected for key \'%s\'",
                   FName::NameData.NameArray[0x19b].Text);
      }
      *(byte *)piVar1 = (byte)*piVar1 & 0xfe;
      goto LAB_00461f0d;
    case 0x19c:
      uVar3 = (this->super_UDMFParserBase).sc.TokenType;
      if ((uVar3 & 0xfffffffe) == 0x150) {
        if (uVar3 == 0x150) {
          *(byte *)piVar2 = (byte)*piVar2 | 1;
          goto LAB_00461f0d;
        }
      }
      else {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Boolean value expected for key \'%s\'",
                   FName::NameData.NameArray[0x19c].Text);
      }
      *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
      goto LAB_00461f0d;
    case 0x19d:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x19d].Text);
      }
      sec->gravity = (this->super_UDMFParserBase).sc.Float;
      goto LAB_00461f0d;
    case 0x19e:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0x19e].Text);
      }
      local_1bc = (anon_union_4_2_12391d7c_for_PalEntry_0)(this->super_UDMFParserBase).sc.Number;
      goto LAB_00461f0d;
    case 0x19f:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0x19f].Text);
      }
      local_1dc = (anon_union_4_2_12391d7c_for_PalEntry_0)(this->super_UDMFParserBase).sc.Number;
      goto LAB_00461f0d;
    case 0x1a0:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1a0].Text);
      }
      local_1c0 = (int)((this->super_UDMFParserBase).sc.Float * 255.0);
      goto LAB_00461f0d;
    case 0x1a1:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"String value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1a1].Text);
      }
      iVar7 = FName::NameManager::FindName
                        (&FName::NameData,(this->super_UDMFParserBase).parsedString.Chars,false);
      (sec->SeqName).super_FName.Index = iVar7;
      sec->seqType = -1;
      goto LAB_00461f0d;
    case 0x1a2:
      iVar7 = 1;
      lVar10 = 0x1a20;
      goto LAB_00462b15;
    case 0x1a3:
      iVar7 = 2;
      lVar10 = 0x1a30;
      goto LAB_00462b15;
    case 0x1a4:
      iVar7 = 4;
      lVar10 = 0x1a40;
      goto LAB_00462b15;
    case 0x1a5:
      iVar7 = 8;
      lVar10 = 0x1a50;
LAB_00462b15:
      UDMFParserBase::Flag<unsigned_int>
                (&this->super_UDMFParserBase,local_168,iVar7,
                 *(char **)((long)&(FName::NameData.NameArray)->Text + lVar10));
      goto LAB_00461f0d;
    case 0x1a6:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1a6].Text);
      }
      sec->planes[0].alpha = (this->super_UDMFParserBase).sc.Float;
      goto LAB_00461f0d;
    case 0x1a7:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1a7].Text);
      }
      sec->planes[1].alpha = (this->super_UDMFParserBase).sc.Float;
      goto LAB_00461f0d;
    case 0x1a8:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"String value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1a8].Text);
      }
      pcVar12 = (this->super_UDMFParserBase).parsedString.Chars;
      iVar7 = strcasecmp(pcVar12,"translucent");
      if (iVar7 == 0) {
        *(byte *)piVar1 = (byte)*piVar1 & 0xfb;
      }
      else {
        iVar7 = strcasecmp(pcVar12,"add");
        if (iVar7 == 0) {
          *(byte *)piVar1 = (byte)*piVar1 | 4;
        }
        else {
          FScanner::ScriptMessage
                    ((FScanner *)this,"Unknown value \"%s\" for \'renderstylefloor\'\n",pcVar12);
        }
      }
      goto LAB_00461f0d;
    case 0x1a9:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"String value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1a9].Text);
      }
      pcVar12 = (this->super_UDMFParserBase).parsedString.Chars;
      iVar7 = strcasecmp(pcVar12,"translucent");
      if (iVar7 == 0) {
        *(byte *)piVar2 = (byte)*piVar2 & 0xfb;
      }
      else {
        iVar7 = strcasecmp(pcVar12,"add");
        if (iVar7 == 0) {
          *(byte *)piVar2 = (byte)*piVar2 | 4;
        }
        else {
          FScanner::ScriptMessage
                    ((FScanner *)this,"Unknown value \"%s\" for \'renderstyleceiling\'\n",pcVar12);
        }
      }
      goto LAB_00461f0d;
    case 0x1aa:
      lVar10 = 0x1aa0;
      goto LAB_00462cab;
    case 0x1ab:
      lVar10 = 0x1ab0;
      piVar9 = piVar2;
      goto LAB_00462e7f;
    case 0x1ac:
      mask = 0x40;
      lVar10 = 0x1ac0;
      piVar9 = piVar2;
      goto LAB_00462e7f;
    case 0x1ad:
      mask = 0x10;
      lVar10 = 0x1ad0;
      piVar9 = piVar2;
      goto LAB_00462e7f;
    case 0x1ae:
      mask = 8;
      lVar10 = 0x1ae0;
      piVar9 = piVar2;
      goto LAB_00462e7f;
    case 0x1af:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"String value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1af].Text);
      }
      local_1b0 = (this->super_UDMFParserBase).parsedString.Chars;
      iVar8 = strcasecmp(local_1b0,"translucent");
      piVar9 = piVar2;
      if (iVar8 != 0) {
        pcVar12 = local_1b0;
        if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"String value expected for key \'%s\'",
                     FName::NameData.NameArray[0x1af].Text);
          pcVar12 = (this->super_UDMFParserBase).parsedString.Chars;
        }
        iVar8 = strcasecmp(pcVar12,"additive");
        goto joined_r0x004625ad;
      }
LAB_00462fc5:
      *(byte *)piVar9 = (byte)*piVar9 & 0xfb;
      break;
    case 0x1b0:
    case 0x1b6:
    case 0x1b7:
    case 0x1b8:
    case 0x1b9:
    case 0x1ba:
    case 0x1bb:
    case 0x1bc:
    case 0x1bd:
    case 0x1be:
    case 0x1bf:
    case 0x1c0:
    case 0x1c1:
    case 0x1c2:
    case 0x1c3:
    case 0x1c4:
    case 0x1c5:
    case 0x1c6:
    case 0x1c7:
    case 0x1c8:
    case 0x1c9:
    case 0x1cb:
    case 0x1cc:
    case 0x1cd:
      break;
    case 0x1b1:
      lVar10 = 0x1b10;
      goto LAB_00462e7f;
    case 0x1b2:
      mask = 0x40;
      lVar10 = 0x1b20;
      goto LAB_00462e7f;
    case 0x1b3:
      mask = 0x10;
      lVar10 = 0x1b30;
      goto LAB_00462e7f;
    case 0x1b4:
      mask = 8;
      lVar10 = 0x1b40;
LAB_00462e7f:
      UDMFParserBase::Flag<int>
                (&this->super_UDMFParserBase,piVar9,mask,
                 *(char **)((long)&(FName::NameData.NameArray)->Text + lVar10));
      break;
    case 0x1b5:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"String value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1b5].Text);
      }
      local_1b0 = (this->super_UDMFParserBase).parsedString.Chars;
      iVar8 = strcasecmp(local_1b0,"translucent");
      if (iVar8 == 0) goto LAB_00462fc5;
      pcVar12 = local_1b0;
      if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"String value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1b5].Text);
        pcVar12 = (this->super_UDMFParserBase).parsedString.Chars;
      }
      iVar8 = strcasecmp(pcVar12,"additive");
joined_r0x004625ad:
      if (iVar8 == 0) {
        *(byte *)piVar9 = (byte)*piVar9 | 4;
      }
      break;
    case 0x1ca:
      iVar8 = 0x100;
      lVar10 = 0x1ca0;
LAB_00462cab:
      UDMFParserBase::Flag<unsigned_short>
                (&this->super_UDMFParserBase,local_150,iVar8,
                 *(char **)((long)&(FName::NameData.NameArray)->Text + lVar10));
      break;
    case 0x1ce:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1ce].Text);
      }
      local_1a0 = (this->super_UDMFParserBase).sc.Float;
      local_1d8 = local_1d8 | 1;
      break;
    case 0x1cf:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1cf].Text);
      }
      local_1a8 = (this->super_UDMFParserBase).sc.Float;
      local_1d8 = local_1d8 | 2;
      break;
    case 0x1d0:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1d0].Text);
      }
      local_198 = (this->super_UDMFParserBase).sc.Float;
      local_1d8 = local_1d8 | 4;
      break;
    case 0x1d1:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1d1].Text);
      }
      local_160 = (this->super_UDMFParserBase).sc.Float;
      local_1d8 = local_1d8 | 8;
      break;
    case 0x1d2:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1d2].Text);
      }
      local_180 = (this->super_UDMFParserBase).sc.Float;
      local_1d4 = local_1d4 | 1;
      break;
    case 0x1d3:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1d3].Text);
      }
      local_190 = (this->super_UDMFParserBase).sc.Float;
      local_1d4 = local_1d4 | 2;
      break;
    case 0x1d4:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1d4].Text);
      }
      local_188 = (this->super_UDMFParserBase).sc.Float;
      local_1d4 = local_1d4 | 4;
      break;
    case 0x1d5:
      if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Floating point value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1d5].Text);
      }
      local_158 = (this->super_UDMFParserBase).sc.Float;
      local_1d4 = local_1d4 | 8;
      break;
    case 0x1d6:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1d6].Text);
      }
      sec->damageamount = (this->super_UDMFParserBase).sc.Number;
      break;
    case 0x1d7:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"String value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1d7].Text);
      }
      iVar8 = FName::NameManager::FindName
                        (&FName::NameData,(this->super_UDMFParserBase).parsedString.Chars,false);
      (sec->damagetype).super_FName.Index = iVar8;
      break;
    case 0x1d8:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1d8].Text);
      }
      sVar6 = (short)(this->super_UDMFParserBase).sc.Number;
      sVar5 = 1;
      if (1 < sVar6) {
        sVar5 = sVar6;
      }
      sec->damageinterval = sVar5;
      break;
    case 0x1d9:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1d9].Text);
      }
      sec->leakydamage = (short)(this->super_UDMFParserBase).sc.Number;
      break;
    case 0x1da:
      iVar8 = 0x80;
      lVar10 = 0x1da0;
      goto LAB_00462b43;
    case 0x1db:
      iVar8 = 0x400;
      lVar10 = 0x1db0;
LAB_00462b43:
      UDMFParserBase::Flag<unsigned_int>
                (&this->super_UDMFParserBase,local_168,iVar8,
                 *(char **)((long)&(FName::NameData.NameArray)->Text + lVar10));
      break;
    case 0x1dc:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"String value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1dc].Text);
      }
      local_140.sc.TokenType =
           FName::NameManager::FindName
                     (&FName::NameData,(this->super_UDMFParserBase).parsedString.Chars,false);
      iVar8 = P_FindTerrain((FName *)&local_140.sc.TokenType);
      sec->terrainnum[0] = iVar8;
      break;
    case 0x1dd:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"String value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1dd].Text);
      }
      local_140.sc.StringLen =
           FName::NameManager::FindName
                     (&FName::NameData,(this->super_UDMFParserBase).parsedString.Chars,false);
      iVar8 = P_FindTerrain((FName *)&local_140.sc.StringLen);
      sec->terrainnum[1] = iVar8;
      break;
    default:
      if (local_140.sc.Number == 0x120) {
        if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"String value expected for key \'%s\'",
                     FName::NameData.NameArray[0x120].Text);
        }
        FString::operator=(&local_1b8,(this->super_UDMFParserBase).parsedString.Chars);
      }
    }
switchD_0046215e_caseD_1b0:
    if ((((this->super_UDMFParserBase).namespace_bits & 0x30) != 0) &&
       (iVar8 = strncasecmp("user_",FName::NameData.NameArray[iVar7].Text,5), iVar8 == 0)) {
      local_16c.Index = iVar7;
      AddUserKey(this,&local_16c,2,index);
    }
  } while( true );
  if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
    FScanner::ScriptMessage
              ((FScanner *)this,"Integer value expected for key \'%s\'",
               FName::NameData.NameArray[0xed].Text);
  }
  uVar3 = (this->super_UDMFParserBase).sc.Number;
  sec->special = (short)uVar3;
  if (this->isTranslated == true) {
    iVar7 = P_TranslateSectorSpecial((int)(short)uVar3);
    sec->special = (short)iVar7;
  }
  else if (((this->super_UDMFParserBase).namespc.Index == 10) &&
          ((0xff < (uVar3 & 0xffff) || ("\x01\x01\x01\x01\x01"[uVar3 & 0xff] == '\0')))) {
    sec->special = 0;
  }
  goto LAB_00461f0d;
}

Assistant:

void ParseSector(sector_t *sec, int index)
	{
		int lightcolor = -1;
		int fadecolor = -1;
		int desaturation = -1;
		int fplaneflags = 0, cplaneflags = 0;
		double fp[4] = { 0 }, cp[4] = { 0 };
		FString tagstring;

		memset(sec, 0, sizeof(*sec));
		sec->lightlevel = 160;
		sec->SetXScale(sector_t::floor, 1.);	// [RH] floor and ceiling scaling
		sec->SetYScale(sector_t::floor, 1.);
		sec->SetXScale(sector_t::ceiling, 1.);
		sec->SetYScale(sector_t::ceiling, 1.);
		sec->SetAlpha(sector_t::floor, 1.);
		sec->SetAlpha(sector_t::ceiling, 1.);
		sec->thinglist = nullptr;
		sec->touching_thinglist = nullptr;		// phares 3/14/98
		sec->render_thinglist = nullptr;
		sec->touching_renderthings = nullptr;
		sec->seqType = (level.flags & LEVEL_SNDSEQTOTALCTRL) ? 0 : -1;
		sec->nextsec = -1;	//jff 2/26/98 add fields to support locking out
		sec->prevsec = -1;	// stair retriggering until build completes
		sec->heightsec = NULL;	// sector used to get floor and ceiling height
		sec->sectornum = index;
		sec->damageinterval = 32;
		sec->terrainnum[sector_t::ceiling] = sec->terrainnum[sector_t::floor] = -1;
		if (floordrop) sec->Flags = SECF_FLOORDROP;
		// killough 3/7/98: end changes

		sec->gravity = 1.;	// [RH] Default sector gravity of 1.0
		sec->ZoneNumber = 0xFFFF;

		// killough 8/28/98: initialize all sectors to normal friction
		sec->friction = ORIG_FRICTION;
		sec->movefactor = ORIG_FRICTION_FACTOR;

		sc.MustGetToken('{');
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch(key)
			{
			case NAME_Heightfloor:
				sec->SetPlaneTexZ(sector_t::floor, CheckFloat(key));
				continue;

			case NAME_Heightceiling:
				sec->SetPlaneTexZ(sector_t::ceiling, CheckFloat(key));
				continue;

			case NAME_Texturefloor:
				SetTexture(sec, index, sector_t::floor, CheckString(key), missingTex, false);
				continue;

			case NAME_Textureceiling:
				SetTexture(sec, index, sector_t::ceiling, CheckString(key), missingTex, false);
				continue;

			case NAME_Lightlevel:
				sec->lightlevel = sector_t::ClampLight(CheckInt(key));
				continue;

			case NAME_Special:
				sec->special = (short)CheckInt(key);
				if (isTranslated) sec->special = P_TranslateSectorSpecial(sec->special);
				else if (namespc == NAME_Hexen)
				{
					if (sec->special < 0 || sec->special > 255 || !HexenSectorSpecialOk[sec->special])
						sec->special = 0;	// NULL all unknown specials
				}
				continue;

			case NAME_Id:
				tagManager.AddSectorTag(index, CheckInt(key));
				continue;

			default:
				break;
			}

			if (namespace_bits & (Zd|Zdt|Va)) switch(key)
			{
				case NAME_Xpanningfloor:
					sec->SetXOffset(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Ypanningfloor:
					sec->SetYOffset(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Xpanningceiling:
					sec->SetXOffset(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Ypanningceiling:
					sec->SetYOffset(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Xscalefloor:
					sec->SetXScale(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Yscalefloor:
					sec->SetYScale(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Xscaleceiling:
					sec->SetXScale(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Yscaleceiling:
					sec->SetYScale(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Rotationfloor:
					sec->SetAngle(sector_t::floor, CheckAngle(key));
					continue;

				case NAME_Rotationceiling:
					sec->SetAngle(sector_t::ceiling, CheckAngle(key));
					continue;

				case NAME_Lightfloor:
					sec->SetPlaneLight(sector_t::floor, CheckInt(key));
					continue;

				case NAME_Lightceiling:
					sec->SetPlaneLight(sector_t::ceiling, CheckInt(key));
					continue;

				case NAME_Alphafloor:
					sec->SetAlpha(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Alphaceiling:
					sec->SetAlpha(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Renderstylefloor:
				{
					const char *str = CheckString(key);
					if (!stricmp(str, "translucent")) sec->ChangeFlags(sector_t::floor, PLANEF_ADDITIVE, 0);
					else if (!stricmp(str, "add")) sec->ChangeFlags(sector_t::floor, 0, PLANEF_ADDITIVE);
					else sc.ScriptMessage("Unknown value \"%s\" for 'renderstylefloor'\n", str);
					continue;
				}

				case NAME_Renderstyleceiling:
				{
					const char *str = CheckString(key);
					if (!stricmp(str, "translucent")) sec->ChangeFlags(sector_t::ceiling, PLANEF_ADDITIVE, 0);
					else if (!stricmp(str, "add")) sec->ChangeFlags(sector_t::ceiling, 0, PLANEF_ADDITIVE);
					else sc.ScriptMessage("Unknown value \"%s\" for 'renderstyleceiling'\n", str);
					continue;
				}

				case NAME_Lightfloorabsolute:
					if (CheckBool(key)) sec->ChangeFlags(sector_t::floor, 0, PLANEF_ABSLIGHTING);
					else sec->ChangeFlags(sector_t::floor, PLANEF_ABSLIGHTING, 0);
					continue;

				case NAME_Lightceilingabsolute:
					if (CheckBool(key)) sec->ChangeFlags(sector_t::ceiling, 0, PLANEF_ABSLIGHTING);
					else sec->ChangeFlags(sector_t::ceiling, PLANEF_ABSLIGHTING, 0);
					continue;

				case NAME_Gravity:
					sec->gravity = CheckFloat(key);
					continue;

				case NAME_Lightcolor:
					lightcolor = CheckInt(key);
					continue;

				case NAME_Fadecolor:
					fadecolor = CheckInt(key);
					continue;

				case NAME_Desaturation:
					desaturation = int(255*CheckFloat(key));
					continue;

				case NAME_Silent:
					Flag(sec->Flags, SECF_SILENT, key);
					continue;

				case NAME_NoRespawn:
					Flag(sec->Flags, SECF_NORESPAWN, key);
					continue;

				case NAME_Nofallingdamage:
					Flag(sec->Flags, SECF_NOFALLINGDAMAGE, key);
					continue;

				case NAME_Dropactors:
					Flag(sec->Flags, SECF_FLOORDROP, key);
					continue;

				case NAME_SoundSequence:
					sec->SeqName = CheckString(key);
					sec->seqType = -1;
					continue;

				case NAME_hidden:
					Flag(sec->MoreFlags, SECF_HIDDEN, key);
					break;

				case NAME_Waterzone:
					Flag(sec->MoreFlags, SECF_UNDERWATER, key);
					break;

				case NAME_floorplane_a:
					fplaneflags |= 1;
					fp[0] = CheckFloat(key);
					break;

				case NAME_floorplane_b:
					fplaneflags |= 2;
					fp[1] = CheckFloat(key);
					break;

				case NAME_floorplane_c:
					fplaneflags |= 4;
					fp[2] = CheckFloat(key);
					break;

				case NAME_floorplane_d:
					fplaneflags |= 8;
					fp[3] = CheckFloat(key);
					break;

				case NAME_ceilingplane_a:
					cplaneflags |= 1;
					cp[0] = CheckFloat(key);
					break;

				case NAME_ceilingplane_b:
					cplaneflags |= 2;
					cp[1] = CheckFloat(key);
					break;

				case NAME_ceilingplane_c:
					cplaneflags |= 4;
					cp[2] = CheckFloat(key);
					break;

				case NAME_ceilingplane_d:
					cplaneflags |= 8;
					cp[3] = CheckFloat(key);
					break;

				case NAME_damageamount:
					sec->damageamount = CheckInt(key);
					break;

				case NAME_damagetype:
					sec->damagetype = CheckString(key);
					break;

				case NAME_damageinterval:
					sec->damageinterval = CheckInt(key);
					if (sec->damageinterval < 1) sec->damageinterval = 1;
					break;

				case NAME_leakiness:
					sec->leakydamage = CheckInt(key);
					break;

				case NAME_damageterraineffect:
					Flag(sec->Flags, SECF_DMGTERRAINFX, key);
					break;

				case NAME_damagehazard:
					Flag(sec->Flags, SECF_HAZARD, key);
					break;

				case NAME_floorterrain:
					sec->terrainnum[sector_t::floor] = P_FindTerrain(CheckString(key));
					break;

				case NAME_ceilingterrain:
					sec->terrainnum[sector_t::ceiling] = P_FindTerrain(CheckString(key));
					break;

				case NAME_MoreIds:
					// delay parsing of the tag string until parsing of the sector is complete
					// This ensures that the ID is always the first tag in the list.
					tagstring = CheckString(key);
					break;

				case NAME_portal_ceil_blocksound:
					Flag(sec->planes[sector_t::ceiling].Flags, PLANEF_BLOCKSOUND, key);
					break;

				case NAME_portal_ceil_disabled:
					Flag(sec->planes[sector_t::ceiling].Flags, PLANEF_DISABLED, key);
					break;

				case NAME_portal_ceil_nopass:
					Flag(sec->planes[sector_t::ceiling].Flags, PLANEF_NOPASS, key);
					break;

				case NAME_portal_ceil_norender:
					Flag(sec->planes[sector_t::ceiling].Flags, PLANEF_NORENDER, key);
					break;

				case NAME_portal_ceil_overlaytype:
					if (!stricmp(CheckString(key), "translucent")) sec->planes[sector_t::ceiling].Flags &= ~PLANEF_ADDITIVE;
					else if (!stricmp(CheckString(key), "additive")) sec->planes[sector_t::ceiling].Flags |= PLANEF_ADDITIVE;
					break;
				
				case NAME_portal_floor_blocksound:
					Flag(sec->planes[sector_t::floor].Flags, PLANEF_BLOCKSOUND, key);
					break;

				case NAME_portal_floor_disabled:
					Flag(sec->planes[sector_t::floor].Flags, PLANEF_DISABLED, key);
					break;

				case NAME_portal_floor_nopass:
					Flag(sec->planes[sector_t::floor].Flags, PLANEF_NOPASS, key);
					break;

				case NAME_portal_floor_norender:
					Flag(sec->planes[sector_t::floor].Flags, PLANEF_NORENDER, key);
					break;

				case NAME_portal_floor_overlaytype:
					if (!stricmp(CheckString(key), "translucent")) sec->planes[sector_t::floor].Flags &= ~PLANEF_ADDITIVE;
					else if (!stricmp(CheckString(key), "additive")) sec->planes[sector_t::floor].Flags |= PLANEF_ADDITIVE;
					break;

				// These two are used by Eternity for something I do not understand.
				//case NAME_portal_ceil_useglobaltex:
				//case NAME_portal_floor_useglobaltex:
					
				default:
					break;
			}
			if ((namespace_bits & (Zd | Zdt)) && !strnicmp("user_", key.GetChars(), 5))
			{
				AddUserKey(key, UDMF_Sector, index);
			}
		}

		if (tagstring.IsNotEmpty())
		{
			FScanner sc;
			sc.OpenString("tagstring", tagstring);
			// scan the string as long as valid numbers can be found
			while (sc.CheckNumber())
			{
				if (sc.Number != 0)	tagManager.AddSectorTag(index, sc.Number);
			}
		}

		if (sec->damageamount == 0)
		{
			// If no damage is set, clear all other related properties so that they do not interfere
			// with other means of setting them.
			sec->damagetype = NAME_None;
			sec->damageinterval = 0;
			sec->leakydamage = 0;
			sec->Flags &= ~SECF_DAMAGEFLAGS;
		}
		
		// Reset the planes to their defaults if not all of the plane equation's parameters were found.
		if (fplaneflags != 15)
		{
			sec->floorplane.SetAtHeight(sec->GetPlaneTexZ(sector_t::floor), sector_t::floor);
		}
		else
		{
			// normalize the vector, it must have a length of 1
			DVector3 n = DVector3(fp[0], fp[1], fp[2]).Unit();
			sec->floorplane.set(n.X, n.Y, n.Z, fp[3]);
		}
		if (cplaneflags != 15)
		{
			sec->ceilingplane.SetAtHeight(sec->GetPlaneTexZ(sector_t::ceiling), sector_t::ceiling);
		}
		else
		{
			DVector3 n = DVector3(cp[0], cp[1], cp[2]).Unit();
			sec->ceilingplane.set(n.X, n.Y, n.Z, cp[3]);
		}

		if (lightcolor == -1 && fadecolor == -1 && desaturation == -1)
		{
			// [RH] Sectors default to white light with the default fade.
			//		If they are outside (have a sky ceiling), they use the outside fog.
			if (level.outsidefog != 0xff000000 && (sec->GetTexture(sector_t::ceiling) == skyflatnum || (sec->special & 0xff) == Sector_Outside))
			{
				if (fogMap == NULL)
					fogMap = GetSpecialLights(PalEntry(255, 255, 255), level.outsidefog, 0);
				sec->ColorMap = fogMap;
			}
			else
			{
				if (normMap == NULL)
					normMap = GetSpecialLights (PalEntry (255,255,255), level.fadeto, NormalLight.Desaturate);
				sec->ColorMap = normMap;
			}
		}
		else
		{
			if (lightcolor == -1) lightcolor = PalEntry(255,255,255);
			if (fadecolor == -1)
			{
				if (level.outsidefog != 0xff000000 && (sec->GetTexture(sector_t::ceiling) == skyflatnum || (sec->special & 0xff) == Sector_Outside))
					fadecolor = level.outsidefog;
				else
					fadecolor = level.fadeto;
			}
			if (desaturation == -1) desaturation = NormalLight.Desaturate;

			sec->ColorMap = GetSpecialLights (lightcolor, fadecolor, desaturation);
		}
	}